

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lf_heter_queue.h
# Opt level: O0

void __thiscall
density::
lf_heter_queue<density::runtime_type<density::f_move_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_(density::consistency_model)0>
::clear(lf_heter_queue<density::runtime_type<density::f_move_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_(density::consistency_model)0>
        *this)

{
  bool bVar1;
  undefined1 local_28 [8];
  consume_operation consume;
  lf_heter_queue<density::runtime_type<density::f_move_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_(density::consistency_model)0>
  *this_local;
  
  consume.m_consume_data.m_next_ptr = (uintptr_t)this;
  consume_operation::consume_operation((consume_operation *)local_28);
  while( true ) {
    bVar1 = try_start_consume(this,(consume_operation *)local_28);
    if (!bVar1) break;
    consume_operation::commit((consume_operation *)local_28);
  }
  consume_operation::~consume_operation((consume_operation *)local_28);
  return;
}

Assistant:

void clear() noexcept
        {
            consume_operation consume;
            while (try_start_consume(consume))
            {
                consume.commit();
            }
        }